

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setRootPrePartials
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *stateFrequenciesIndices,
          int count)

{
  double **ppdVar1;
  double *__src;
  int iVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  iVar4 = -7;
  if ((count == 1) && (iVar4 = -7, this->kAutoRootPartitioningEnabled == false)) {
    lVar7 = (long)*bufferIndices;
    iVar4 = -5;
    if ((-1 < lVar7) && (*bufferIndices < *(int *)&(this->super_BeagleImpl).field_0xc)) {
      iVar4 = *stateFrequenciesIndices;
      ppdVar1 = this->gPartials;
      if (ppdVar1[lVar7] == (double *)0x0) {
        pdVar3 = (double *)malloc((long)this->kPartialsSize << 3);
        ppdVar1[lVar7] = pdVar3;
        if (this->gPartials[lVar7] == (double *)0x0) {
          return -2;
        }
      }
      if (0 < this->kCategoryCount) {
        __src = this->gStateFrequencies[iVar4];
        pdVar3 = this->gPartials[lVar7];
        iVar4 = 0;
        do {
          iVar2 = this->kPatternCount;
          if (0 < iVar2) {
            iVar5 = 0;
            do {
              memcpy(pdVar3,__src,(ulong)(uint)this->kStateCount << 3);
              pdVar3 = pdVar3 + this->kPartialsPaddedStateCount;
              iVar5 = iVar5 + 1;
              iVar2 = this->kPatternCount;
            } while (iVar5 < iVar2);
          }
          uVar6 = (this->kPaddedPatternCount - iVar2) * this->kPartialsPaddedStateCount;
          if (0 < (int)uVar6) {
            memset(pdVar3,0,(ulong)uVar6 << 3);
            pdVar3 = pdVar3 + (ulong)(uVar6 - 1) + 1;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < this->kCategoryCount);
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setRootPrePartials(const int *bufferIndices,
                                                          const int *stateFrequenciesIndices,
                                                          int count) {
    if (count == 1) {
        // We treat this as a special case so that we don't have convoluted logic
        //      at the end of the loop over patterns
        if (kAutoRootPartitioningEnabled) {
//            calcRootLogLikelihoodsByAutoPartitionAsync(bufferIndices,
//                                                       categoryWeightsIndices,
//                                                       stateFrequenciesIndices,
//                                                       cumulativeScaleIndices,
//                                                       gAutoPartitionIndices,
//                                                       gAutoPartitionOutSumLogLikelihoods);
//
//            *outSumLogLikelihood = 0.0;
//
//            for (int i = 0; i < kPartitionCount; i++) {
//                *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
//            }
//
//            if (*outSumLogLikelihood != *outSumLogLikelihood) {
//                return BEAGLE_ERROR_FLOATING_POINT;
//            } else {
//                return BEAGLE_SUCCESS;
//            }
            return BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {
            int stateFrequenciesIndex = stateFrequenciesIndices[0];
            int bufferIndex = bufferIndices[0];
            if (bufferIndex < 0 || bufferIndex >= kBufferCount)
                return BEAGLE_ERROR_OUT_OF_RANGE;
            if (gPartials[bufferIndex] == NULL) {
                gPartials[bufferIndex] = (REALTYPE *) malloc(sizeof(REALTYPE) * kPartialsSize);
                if (gPartials[bufferIndex] == 0L)
                    return BEAGLE_ERROR_OUT_OF_MEMORY;
            }
            const REALTYPE *inPartialsOffset = gStateFrequencies[stateFrequenciesIndex];
            REALTYPE *tmpRealPartialsOffset = gPartials[bufferIndex];
            for (int l = 0; l < kCategoryCount; l++) {
                for (int i = 0; i < kPatternCount; i++) {
                    beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
                    tmpRealPartialsOffset += kPartialsPaddedStateCount;
                }
                // Pad extra buffer with zeros
                for (int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
                    *tmpRealPartialsOffset++ = 0;
                }
            }

            return BEAGLE_SUCCESS;
        }
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }
    return BEAGLE_ERROR_NO_IMPLEMENTATION;

}